

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O2

bool __thiscall
Args::Command::isMisspelledCommand(Command *this,String *nm,StringList *possibleNames)

{
  bool bVar1;
  String SStack_48;
  
  (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&SStack_48,this);
  bVar1 = details::isMisspelledName(nm,&SStack_48);
  std::__cxx11::string::~string((string *)&SStack_48);
  if (bVar1) {
    (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&SStack_48,this);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)possibleNames,
               &SStack_48);
    std::__cxx11::string::~string((string *)&SStack_48);
  }
  return bVar1;
}

Assistant:

bool isMisspelledCommand(
		//! Name to check (misspelled).
		const String & nm,
		//! List of possible names for the given misspelled name.
		StringList & possibleNames ) const
	{
		if( details::isMisspelledName( nm, name() ) )
		{
			possibleNames.push_back( name() );

			return true;
		}
		else
			return false;
	}